

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O3

void __thiscall
icu_63::numparse::impl::AffixPatternMatcherBuilder::consumeToken
          (AffixPatternMatcherBuilder *this,AffixPatternType type,UChar32 cp,UErrorCode *status)

{
  UBool UVar1;
  UnicodeSet *pUVar2;
  NumberParseMatcher *pNVar3;
  SymbolMatcher *this_00;
  
  this_00 = &this->fIgnorables->super_SymbolMatcher;
  if ((this_00 != (SymbolMatcher *)0x0) && (0 < this->fMatchersLen)) {
    if (-1 < this->fLastTypeOrCp) {
      pUVar2 = SymbolMatcher::getSet(this_00);
      UVar1 = UnicodeSet::contains(pUVar2,this->fLastTypeOrCp);
      if (UVar1 != '\0') goto code_r0x0028079e;
      this_00 = &this->fIgnorables->super_SymbolMatcher;
    }
    (*(this->super_TokenConsumer)._vptr_TokenConsumer[3])(this,this_00);
  }
code_r0x0028079e:
  switch(type) {
  case TYPE_CODEPOINT:
    if (&this->fIgnorables->super_SymbolMatcher != (SymbolMatcher *)0x0) {
      pUVar2 = SymbolMatcher::getSet(&this->fIgnorables->super_SymbolMatcher);
      UVar1 = UnicodeSet::contains(pUVar2,cp);
      type = cp;
      if (UVar1 != '\0') goto switchD_002807ac_default;
    }
    pNVar3 = CodePointMatcherWarehouse::nextCodePointMatcher(&this->fWarehouse->fCodePoints,cp);
    break;
  case TYPE_CURRENCY_QUINT:
  case TYPE_CURRENCY_QUAD:
  case TYPE_CURRENCY_TRIPLE:
  case TYPE_CURRENCY_DOUBLE:
  case TYPE_CURRENCY_SINGLE:
    pNVar3 = AffixTokenMatcherWarehouse::currency(this->fWarehouse,status);
    cp = type;
    break;
  case TYPE_PERMILLE:
    pNVar3 = AffixTokenMatcherWarehouse::permille(this->fWarehouse);
    cp = TYPE_PERMILLE;
    break;
  case TYPE_PERCENT:
    pNVar3 = AffixTokenMatcherWarehouse::percent(this->fWarehouse);
    cp = TYPE_PERCENT;
    break;
  case TYPE_PLUS_SIGN:
    pNVar3 = AffixTokenMatcherWarehouse::plusSign(this->fWarehouse);
    cp = TYPE_PLUS_SIGN;
    break;
  case TYPE_MINUS_SIGN:
    pNVar3 = AffixTokenMatcherWarehouse::minusSign(this->fWarehouse);
    cp = TYPE_MINUS_SIGN;
    break;
  default:
    goto switchD_002807ac_default;
  }
  (*(this->super_TokenConsumer)._vptr_TokenConsumer[3])(this,pNVar3);
  type = cp;
switchD_002807ac_default:
  this->fLastTypeOrCp = type;
  return;
}

Assistant:

void AffixPatternMatcherBuilder::consumeToken(AffixPatternType type, UChar32 cp, UErrorCode& status) {
    // This is called by AffixUtils.iterateWithConsumer() for each token.

    // Add an ignorables matcher between tokens except between two literals, and don't put two
    // ignorables matchers in a row.
    if (fIgnorables != nullptr && fMatchersLen > 0 &&
        (fLastTypeOrCp < 0 || !fIgnorables->getSet()->contains(fLastTypeOrCp))) {
        addMatcher(*fIgnorables);
    }

    if (type != TYPE_CODEPOINT) {
        // Case 1: the token is a symbol.
        switch (type) {
            case TYPE_MINUS_SIGN:
                addMatcher(fWarehouse.minusSign());
                break;
            case TYPE_PLUS_SIGN:
                addMatcher(fWarehouse.plusSign());
                break;
            case TYPE_PERCENT:
                addMatcher(fWarehouse.percent());
                break;
            case TYPE_PERMILLE:
                addMatcher(fWarehouse.permille());
                break;
            case TYPE_CURRENCY_SINGLE:
            case TYPE_CURRENCY_DOUBLE:
            case TYPE_CURRENCY_TRIPLE:
            case TYPE_CURRENCY_QUAD:
            case TYPE_CURRENCY_QUINT:
                // All currency symbols use the same matcher
                addMatcher(fWarehouse.currency(status));
                break;
            default:
                U_ASSERT(FALSE);
        }

    } else if (fIgnorables != nullptr && fIgnorables->getSet()->contains(cp)) {
        // Case 2: the token is an ignorable literal.
        // No action necessary: the ignorables matcher has already been added.

    } else {
        // Case 3: the token is a non-ignorable literal.
        addMatcher(fWarehouse.nextCodePointMatcher(cp));
    }
    fLastTypeOrCp = type != TYPE_CODEPOINT ? type : cp;
}